

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartType.cpp
# Opt level: O0

bool Imf_3_4::isDeepData(string *name)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  undefined1 local_9;
  
  _Var1 = std::operator==(name,in_stack_00000008);
  local_9 = true;
  if (!_Var1) {
    local_9 = std::operator==(name,in_stack_00000008);
  }
  return local_9;
}

Assistant:

bool
isDeepData (const string& name)
{
    return (name == DEEPTILE || name == DEEPSCANLINE);
}